

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

int __thiscall libwebvtt::Parser::Init(Parser *this)

{
  int iVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  string line;
  string local_50;
  
  iVar1 = ParseBOM(this);
  bVar4 = iVar1 == 0;
  if ((-1 < iVar1) && (iVar1 = -1, bVar4)) {
    cVar2 = 'W';
    lVar3 = 1;
    do {
      iVar1 = (**(this->super_LineReader).super_Reader._vptr_Reader)(this,&local_50);
      if (iVar1 < 0) {
        return iVar1;
      }
      if ((iVar1 != 0) || ((char)local_50._M_dataplus._M_p != cVar2)) {
        return -1;
      }
      cVar2 = (&DAT_00130292)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    iVar1 = LineReader::GetLine(&this->super_LineReader,&local_50);
    if (((-1 < iVar1) && (bVar4 = iVar1 == 0, iVar1 = 0, bVar4)) &&
       ((local_50._M_string_length == 0 ||
        ((*local_50._M_dataplus._M_p == ' ' || (iVar1 = -1, *local_50._M_dataplus._M_p == '\t'))))))
    {
      iVar1 = LineReader::GetLine(&this->super_LineReader,&local_50);
      bVar4 = iVar1 == 0;
      if ((-1 < iVar1) && (iVar1 = 0, bVar4)) {
        iVar1 = -(uint)(local_50._M_string_length != 0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return iVar1;
}

Assistant:

int Parser::Init() {
  int e = ParseBOM();

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return -1;

  // Parse "WEBVTT".  We read from the stream one character at-a-time, in
  // order to defend against non-WebVTT streams (e.g. binary files) that don't
  // happen to comprise lines of text demarcated with line terminators.

  const char kId[] = "WEBVTT";

  for (const char* p = kId; *p; ++p) {
    char c;
    e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    if (c != *p)
      return -1;
  }

  std::string line;

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but valid

  if (!line.empty()) {
    // Parse optional characters that follow "WEBVTT"

    const char c = line[0];

    if (c != kSPACE && c != kTAB)
      return -1;
  }

  // The WebVTT spec requires that the "WEBVTT" line
  // be followed by an empty line (to separate it from
  // first cue).

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but we allow it

  if (!line.empty())
    return -1;

  return 0;  // success
}